

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_functional.h
# Opt level: O3

VarOrConst __thiscall
mp::
BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>
::Convert(BasicFCC<mp::FCC<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::ExpId>_>
          *this)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  undefined8 in_RAX;
  undefined7 extraout_var;
  undefined8 extraout_RAX;
  anon_union_8_2_43b0091d_for_VarOrConst_1 aVar5;
  double dVar6;
  NodeRange NVar7;
  VarOrConst VVar8;
  
  dVar2 = (this->prepro_).lb_;
  dVar6 = 0.0;
  if (0.0 <= dVar2) {
    dVar6 = dVar2;
  }
  (this->prepro_).lb_ = dVar6;
  pdVar1 = &(this->prepro_).ub_;
  if ((dVar6 == *pdVar1) && (!NAN(dVar6) && !NAN(*pdVar1))) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = dVar6;
    return (VarOrConst)(auVar3 << 0x40);
  }
  aVar5 = (anon_union_8_2_43b0091d_for_VarOrConst_1)(long)(this->prepro_).result_var_;
  if ((long)aVar5 < 0) {
    bVar4 = MapFind(this);
    in_RAX = CONCAT71(extraout_var,bVar4);
    if (!bVar4) {
      NVar7 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::AddVar(&this->converter_->
                        super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                       ,(this->prepro_).lb_,(this->prepro_).ub_,(this->prepro_).type_);
      (this->prepro_).result_var_ = NVar7.ir_.beg_;
      (this->constr_).super_FunctionalConstraint.result_var_ = NVar7.ir_.beg_;
      AddConstraint(this);
      in_RAX = extraout_RAX;
    }
    aVar5._4_4_ = 0;
    aVar5.var_ = (this->prepro_).result_var_;
  }
  VVar8._1_7_ = (undefined7)((ulong)in_RAX >> 8);
  VVar8.is_v_ = true;
  VVar8.field_1.c_ = aVar5.c_;
  return VVar8;
}

Assistant:

VarOrConst Convert() {
    MP_DISPATCH( PreprocessArguments() );
    if (ResultIsConstant())
      return VarOrConst::MakeConst( lb() );
    if (ResultVarIsKnown())
      return VarOrConst::MakeVar( GetResultVar() );
    if (MapFind())
      return VarOrConst::MakeVar( GetResultVar() );
    MP_DISPATCH( AddResultVariable() );
    MP_DISPATCH( AddConstraint() );
    return VarOrConst::MakeVar( GetResultVar() );
  }